

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_reshape_before_binaryop(NetOptimize *this)

{
  int iVar1;
  int iVar2;
  value_type pLVar3;
  value_type pLVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  reference ppLVar8;
  reference pvVar9;
  const_iterator __first;
  undefined8 uVar10;
  reference pvVar11;
  long in_RDI;
  int bottom_blob_index_final;
  BinaryOp *binaryop;
  int j;
  int top_blob_index;
  Reshape *reshape;
  int i;
  int layer_count;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int local_20;
  int local_10;
  
  sVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  iVar6 = (int)sVar7;
  local_10 = 0;
  do {
    if (iVar6 <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_10);
    bVar5 = std::operator!=(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    if (!bVar5) {
      ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_10);
      pLVar3 = *ppLVar8;
      if (((*(int *)&pLVar3[1]._vptr_Layer == 1) &&
          (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 1)) && (pLVar3[1].typeindex == 0)) {
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_10);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->tops,0);
        iVar1 = *pvVar9;
        local_20 = local_10;
        do {
          do {
            do {
              local_20 = local_20 + 1;
              if (iVar6 <= local_20) goto LAB_0011986f;
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                         (long)local_20);
              bVar5 = std::operator!=(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
            } while (bVar5);
            ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 0x40),(long)local_20);
            sVar7 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar8)->bottoms);
          } while (sVar7 != 2);
          ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_20);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->bottoms,0);
          if (*pvVar9 == iVar1) break;
          ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_20);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->bottoms,1);
        } while (*pvVar9 != iVar1);
LAB_0011986f:
        if (local_20 != iVar6) {
          ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_20);
          pLVar4 = *ppLVar8;
          __last._M_current = &_stderr->_flags;
          __first._M_current = (int *)std::__cxx11::string::c_str();
          uVar10 = std::__cxx11::string::c_str();
          fprintf((FILE *)__last._M_current,"eliminate_reshape_before_binaryop %s %s\n",
                  __first._M_current,uVar10);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->bottoms,0);
          iVar2 = *pvVar9;
          ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_20);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->bottoms,0);
          if (*pvVar9 == iVar1) {
            in_stack_ffffffffffffff8c = iVar2;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->bottoms,0);
            *pvVar9 = in_stack_ffffffffffffff8c;
          }
          ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_20);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->bottoms,1);
          if (*pvVar9 == iVar1) {
            in_stack_ffffffffffffff88 = iVar2;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->bottoms,1);
            *pvVar9 = in_stack_ffffffffffffff88;
          }
          pvVar11 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                               (long)iVar2);
          in_stack_ffffffffffffff80 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pvVar11->consumers;
          std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                    ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),(long)iVar2)
          ;
          std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
          std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                    ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),(long)iVar2)
          ;
          std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
          std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     __first._M_current,__last,
                     (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
          __normal_iterator<int*>
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff80,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff78);
          std::vector<int,_std::allocator<int>_>::erase
                    ((vector<int,_std::allocator<int>_> *)__last._M_current,__first);
          std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                    ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),(long)iVar2)
          ;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)__last._M_current,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
        }
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_reshape_before_binaryop()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Reshape")
            continue;

        ncnn::Reshape* reshape = (ncnn::Reshape*)layers[i];
        if (reshape->w != 1 || reshape->h != 1 || reshape->permute != 0)
            continue;

        // Reshape - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index || layers[j]->bottoms[1] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        fprintf(stderr, "eliminate_reshape_before_binaryop %s %s\n", reshape->name.c_str(), binaryop->name.c_str());

        int bottom_blob_index_final = reshape->bottoms[0];
        if (layers[j]->bottoms[0] == top_blob_index)
            binaryop->bottoms[0] = bottom_blob_index_final;
        if (layers[j]->bottoms[1] == top_blob_index)
            binaryop->bottoms[1] = bottom_blob_index_final;
        blobs[bottom_blob_index_final].consumers.erase(std::find(blobs[bottom_blob_index_final].consumers.begin(), blobs[bottom_blob_index_final].consumers.end(), i));
        blobs[bottom_blob_index_final].consumers.push_back(j);
        reshape->type = "ncnnfused";
    }

    return 0;
}